

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqliteErrorFromPosixError(int posixError,int sqliteIOErr)

{
  int sqliteIOErr_local;
  int posixError_local;
  int local_4;
  
  if (posixError == 1) {
    local_4 = 3;
  }
  else if ((((posixError == 4) || (posixError == 0xb)) || (posixError == 0xd)) ||
          (((posixError == 0x10 || (posixError == 0x25)) ||
           (local_4 = sqliteIOErr, posixError == 0x6e)))) {
    local_4 = 5;
  }
  return local_4;
}

Assistant:

static int sqliteErrorFromPosixError(int posixError, int sqliteIOErr) {
  assert( (sqliteIOErr == SQLITE_IOERR_LOCK) ||
          (sqliteIOErr == SQLITE_IOERR_UNLOCK) ||
          (sqliteIOErr == SQLITE_IOERR_RDLOCK) ||
          (sqliteIOErr == SQLITE_IOERR_CHECKRESERVEDLOCK) );
  switch (posixError) {
  case EACCES:
  case EAGAIN:
  case ETIMEDOUT:
  case EBUSY:
  case EINTR:
  case ENOLCK:
    /* random NFS retry error, unless during file system support
     * introspection, in which it actually means what it says */
    return SQLITE_BUSY;

  case EPERM:
    return SQLITE_PERM;

  default:
    return sqliteIOErr;
  }
}